

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  Column *this_00;
  ostream *poVar1;
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  Column *in_stack_00000008;
  ostream *in_stack_00000010;
  size_t i;
  string *in_stack_ffffffffffffff78;
  Column local_50;
  long local_20;
  size_t local_18;
  
  local_18 = in_RDX;
  local_20 = std::__cxx11::string::find(in_RSI,0x1e0510);
  if (local_20 == -1) {
    local_20 = 0;
  }
  else {
    local_20 = local_20 + 2;
  }
  clara::TextFlow::Column::Column(*(Column **)(in_RDI + 0x18),in_stack_ffffffffffffff78);
  this_00 = clara::TextFlow::Column::indent(&local_50,local_18 + local_20);
  clara::TextFlow::Column::initialIndent(this_00,local_18);
  poVar1 = clara::TextFlow::operator<<(in_stack_00000010,in_stack_00000008);
  std::operator<<(poVar1,'\n');
  clara::TextFlow::Column::~Column((Column *)0x137e1a);
  return;
}

Assistant:

void ConsoleReporter::printHeaderString(std::string const& _string, std::size_t indent) {
    std::size_t i = _string.find(": ");
    if (i != std::string::npos)
        i += 2;
    else
        i = 0;
    stream << Column(_string).indent(indent + i).initialIndent(indent) << '\n';
}